

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O2

void __thiscall
Component_addAndCountChildren_Test::Component_addAndCountChildren_Test
          (Component_addAndCountChildren_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00123b00;
  return;
}

Assistant:

TEST(Component, addAndCountChildren)
{
    libcellml::ComponentPtr parent = libcellml::Component::create();
    parent->setName("parent");
    libcellml::ComponentPtr child1 = libcellml::Component::create();
    child1->setName("child1");
    libcellml::ComponentPtr child2 = libcellml::Component::create();
    child2->setName("child2");
    libcellml::ComponentPtr child3 = libcellml::Component::create();
    child3->setName("child3");
    libcellml::ComponentPtr child4 = libcellml::Component::create();
    child4->setName("child4");

    EXPECT_EQ(size_t(0), parent->componentCount());

    parent->addComponent(child1);
    parent->addComponent(child2);
    parent->addComponent(child3);
    parent->addComponent(child4);
    EXPECT_EQ(size_t(4), parent->componentCount());

    child3->addComponent(child4);
    parent->addComponent(child3);
    EXPECT_EQ(size_t(4), parent->componentCount());

    EXPECT_EQ(size_t(1), child3->componentCount());
}